

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::AST_const*>
          (Stack *this,FrameKind args,AST *args_1)

{
  pointer __first;
  _Tp_alloc_type *p_Var1;
  pointer __result;
  pointer pFVar2;
  AST **in_RCX;
  _Tp_alloc_type *__alloc;
  undefined4 in_register_00000034;
  long lVar3;
  _Tp_alloc_type *this_00;
  
  pFVar2 = *(pointer *)(this + 0x18);
  if (pFVar2 == *(pointer *)(this + 0x20)) {
    __first = *(pointer *)(this + 0x10);
    lVar3 = (long)pFVar2 - (long)__first;
    if (lVar3 == 0x7fffffffffffff30) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    __alloc = (_Tp_alloc_type *)((lVar3 >> 4) * -0x70a3d70a3d70a3d7);
    p_Var1 = (_Tp_alloc_type *)0x1;
    if (pFVar2 != __first) {
      p_Var1 = __alloc;
    }
    this_00 = p_Var1 + (long)__alloc;
    if ((_Tp_alloc_type *)0x51eb851eb851ea < this_00) {
      this_00 = (_Tp_alloc_type *)0x51eb851eb851eb;
    }
    if (CARRY8((ulong)p_Var1,(ulong)__alloc)) {
      this_00 = (_Tp_alloc_type *)0x51eb851eb851eb;
    }
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              *)this_00,CONCAT44(in_register_00000034,args));
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)(lVar3 + (long)__result),(Frame *)(ulong)args,(FrameKind *)args_1,
               (AST **)__alloc);
    pFVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,pFVar2,__result,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first,*(long *)(this + 0x20) - (long)__first);
    }
    *(pointer *)(this + 0x10) = __result;
    *(pointer *)(this + 0x18) = pFVar2 + 1;
    *(pointer *)(this + 0x20) = __result + (long)this_00;
  }
  else {
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)pFVar2,(Frame *)(ulong)args,(FrameKind *)args_1,in_RCX);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 400;
  }
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }